

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_p_p.h
# Opt level: O3

void __thiscall
QNativeSocketEnginePrivate::setPortAndAddress
          (QNativeSocketEnginePrivate *this,quint16 port,QHostAddress *address,qt_sockaddr *aa,
          socklen_t *sockAddrSize)

{
  NetworkLayerProtocol NVar1;
  uint32_t uVar2;
  quint32 qVar3;
  NetworkLayerProtocol NVar4;
  socklen_t sVar5;
  long in_FS_OFFSET;
  anon_union_16_3_a3f0114d_for___in6_u aVar6;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  NVar1 = (this->super_QAbstractSocketEnginePrivate).socketProtocol;
  if ((uint)(NVar1 + UnknownNetworkLayerProtocol) < 2) {
LAB_00230981:
    ((char *)((long)aa + 2))[2] = '\0';
    ((char *)((long)aa + 2))[3] = '\0';
    ((char *)((long)aa + 2))[4] = '\0';
    ((char *)((long)aa + 2))[5] = '\0';
    ((char *)((long)aa + 2))[6] = '\0';
    ((char *)((long)aa + 2))[7] = '\0';
    ((char *)((long)aa + 2))[8] = '\0';
    ((char *)((long)aa + 2))[9] = '\0';
    *(undefined8 *)((aa->a).sa_data + 10) = 0;
    *(undefined8 *)((long)&(aa->a6).sin6_addr.__in6_u + 0xc) = 0;
    (aa->a).sa_family = 10;
    (aa->a4).sin_port = port << 8 | port >> 8;
    aVar6 = (anon_union_16_3_a3f0114d_for___in6_u)QHostAddress::toIPv6Address(address);
    (aa->a6).sin6_addr.__in6_u = aVar6;
    QHostAddress::scopeId(&local_48,address);
    uVar2 = QNetworkInterface::interfaceIndexFromName(&local_48);
    (aa->a6).sin6_scope_id = uVar2;
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    sVar5 = 0x1c;
  }
  else {
    if (NVar1 != IPv4Protocol) {
      NVar4 = QHostAddress::protocol(address);
      if ((uint)(NVar4 + UnknownNetworkLayerProtocol) < 2) goto LAB_00230981;
      if (NVar4 != IPv4Protocol) {
        *(undefined8 *)aa = 0;
        ((char *)((long)aa + 2))[6] = '\0';
        ((char *)((long)aa + 2))[7] = '\0';
        ((char *)((long)aa + 2))[8] = '\0';
        ((char *)((long)aa + 2))[9] = '\0';
        ((char *)((long)aa + 2))[10] = '\0';
        ((char *)((long)aa + 2))[0xb] = '\0';
        ((char *)((long)aa + 2))[0xc] = '\0';
        ((char *)((long)aa + 2))[0xd] = '\0';
        sVar5 = 0;
        goto LAB_00230a2a;
      }
    }
    ((char *)((long)aa + 2))[10] = '\0';
    ((char *)((long)aa + 2))[0xb] = '\0';
    ((char *)((long)aa + 2))[0xc] = '\0';
    ((char *)((long)aa + 2))[0xd] = '\0';
    ((char *)((long)aa + 2))[2] = '\0';
    ((char *)((long)aa + 2))[3] = '\0';
    ((char *)((long)aa + 2))[4] = '\0';
    ((char *)((long)aa + 2))[5] = '\0';
    ((char *)((long)aa + 2))[6] = '\0';
    ((char *)((long)aa + 2))[7] = '\0';
    ((char *)((long)aa + 2))[8] = '\0';
    ((char *)((long)aa + 2))[9] = '\0';
    (aa->a).sa_family = 2;
    (aa->a4).sin_port = port << 8 | port >> 8;
    qVar3 = QHostAddress::toIPv4Address(address,(bool *)0x0);
    (aa->a6).sin6_flowinfo =
         qVar3 >> 0x18 | (qVar3 & 0xff0000) >> 8 | (qVar3 & 0xff00) << 8 | qVar3 << 0x18;
    sVar5 = 0x10;
  }
LAB_00230a2a:
  *sockAddrSize = sVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setPortAndAddress(quint16 port, const QHostAddress &address, qt_sockaddr *aa, QT_SOCKLEN_T *sockAddrSize)
    {
        switch (socketProtocol) {
        case QHostAddress::IPv6Protocol:
        case QHostAddress::AnyIPProtocol:
            // force to IPv6
            setSockaddr(&aa->a6, address, port);
            *sockAddrSize = sizeof(sockaddr_in6);
            return;

        case QHostAddress::IPv4Protocol:
            // force to IPv4
            setSockaddr(&aa->a4, address, port);
            *sockAddrSize = sizeof(sockaddr_in);
            return;

        case QHostAddress::UnknownNetworkLayerProtocol:
            // don't force
            break;
        }
        *sockAddrSize = setSockaddr(&aa->a, address, port);
    }